

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O0

void anurbs::
     CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
     ::register_python(module *m)

{
  char *name_00;
  arg aVar1;
  undefined1 local_a8;
  arg local_a0;
  arg local_90;
  arg local_80;
  arg local_70;
  arg local_60;
  constructor<std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>,_anurbs::Interval>
  local_4d [13];
  handle local_40;
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  ::python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::class_<>(&local_38,local_40,name_00);
  pybind11::
  init<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>,anurbs::Interval>
            ();
  local_70 = pybind11::literals::operator____a("curve_geometry",0xe);
  local_60.name = local_70.name;
  local_60._8_1_ = local_70._8_1_;
  local_90 = pybind11::literals::operator____a("surface_geometry",0x10);
  local_80.name = local_90.name;
  local_80._8_1_ = local_90._8_1_;
  aVar1 = pybind11::literals::operator____a("domain",6);
  local_a0.name = aVar1.name;
  local_a8 = aVar1._8_1_;
  local_a0._8_1_ = local_a8;
  pybind11::
  class_<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>>>
  ::
  def<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>,anurbs::Interval,pybind11::arg,pybind11::arg,pybind11::arg>
            ((class_<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>>>
              *)&local_38,local_4d,&local_60,&local_80,&local_a0);
  pybind11::
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::~class_(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = CurveOnSurface<TDimension>;
        using Base = CurveBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TCurveRef, TSurfaceRef,
                Interval>(), "curve_geometry"_a, "surface_geometry"_a,
                "domain"_a)
        ;
    }